

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>::eval_divide_knuth
          (uintwide_t<24U,_unsigned_char,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  int_fast8_t iVar1;
  enable_if_t<(_false),_uintwide_t<24U,_unsigned_char>_> eVar2;
  unsigned_fast_type uVar3;
  value_type_conflict4 *pvVar4;
  unsigned_fast_type u_offset;
  long lVar5;
  undefined2 *this_00;
  undefined2 local_34;
  value_type_conflict4 local_32;
  undefined2 local_31;
  value_type_conflict4 local_2f;
  undefined2 local_2e;
  value_type_conflict4 local_2c;
  undefined2 local_2b;
  
  uVar3 = 0;
  for (pvVar4 = (this->values).super_array<unsigned_char,_3UL>.elems + 2;
      (u_offset = 3, uVar3 != 3 && (u_offset = uVar3, *pvVar4 == '\0')); pvVar4 = pvVar4 + -1) {
    uVar3 = uVar3 + 1;
  }
  lVar5 = 0;
  do {
    if (lVar5 == -3) {
LAB_0013f72a:
      eVar2 = limits_helper_max<false>();
      *(short *)(this->values).super_array<unsigned_char,_3UL>.elems =
           eVar2.values.super_array<unsigned_char,_3UL>.elems._0_2_;
      (this->values).super_array<unsigned_char,_3UL>.elems[2] =
           eVar2.values.super_array<unsigned_char,_3UL>.elems[2];
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          (remainder->values).super_array<unsigned_char,_3UL>.elems[lVar5] = '\0';
        }
      }
      return;
    }
    if ((other->values).super_array<unsigned_char,_3UL>.elems[lVar5 + 2] != '\0') {
      if (lVar5 != -3) {
        if (u_offset == 3) {
          if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
            return;
          }
          this_00 = &local_2b;
        }
        else {
          iVar1 = compare<false,_nullptr>(this,other);
          if (iVar1 != '\0') {
            if (iVar1 == -1) {
              if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
                (remainder->values).super_array<unsigned_char,_3UL>.elems[2] =
                     (this->values).super_array<unsigned_char,_3UL>.elems[2];
                *(undefined2 *)(remainder->values).super_array<unsigned_char,_3UL>.elems =
                     *(undefined2 *)(this->values).super_array<unsigned_char,_3UL>.elems;
              }
              uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std
              ::enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
              value)&&(std::numeric_limits<unsigned_char>::digits<=std::
              numeric_limits<unsigned_char>::digits),void>::type__
                        (&local_2e,'\0',
                         (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                          *)0x0);
              (this->values).super_array<unsigned_char,_3UL>.elems[2] = local_2c;
              *(undefined2 *)(this->values).super_array<unsigned_char,_3UL>.elems = local_2e;
              return;
            }
            void_math::wide_integer::uintwide_t<24u,unsigned_char,void,false>::
            eval_divide_knuth_core<24u>(unsigned_long,unsigned_long,math::wide_integer::
            uintwide_t<24u,unsigned_char,void,false>const&,math::wide_integer::
            uintwide_t<24u,unsigned_char,void,false>*,std::
            enable_if<((24u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_char>::
            digits))),int>::type__
                      (this,u_offset,-lVar5,other,remainder,
                       (enable_if_t<(24U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                        *)0x0);
            return;
          }
          uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::
          digits),void>::type__
                    (&local_31,'\x01',
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          (this->values).super_array<unsigned_char,_3UL>.elems[2] = local_2f;
          *(undefined2 *)(this->values).super_array<unsigned_char,_3UL>.elems = local_31;
          if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
            return;
          }
          this_00 = &local_34;
        }
        uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::
        digits),void>::type__
                  (this_00,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        (remainder->values).super_array<unsigned_char,_3UL>.elems[2] =
             *(value_type_conflict4 *)(this_00 + 1);
        *(undefined2 *)(remainder->values).super_array<unsigned_char,_3UL>.elems = *this_00;
        return;
      }
      goto LAB_0013f72a;
    }
    lVar5 = lVar5 + -1;
  } while( true );
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }